

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (Matches *__return_storage_ptr__,TestSpec *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
          IConfig *config)

{
  TestSpec *pTVar1;
  pointer pTVar2;
  bool bVar3;
  Filter *extraout_RDX;
  Filter *extraout_RDX_00;
  Filter *extraout_RDX_01;
  Filter *extraout_RDX_02;
  Filter *filter;
  Filter *extraout_RDX_03;
  TestCaseHandle *test;
  pointer testCase;
  TestSpec *this_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range2;
  vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
  currentMatches;
  FilterMatch local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_filters).
                    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_filters).
                   super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pTVar1 = (TestSpec *)
           (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  filter = extraout_RDX;
  for (this_00 = (TestSpec *)
                 (this->m_filters).
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1
      ) {
    currentMatches.
    super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    currentMatches.
    super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    currentMatches.
    super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar2 = (testCases->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (testCase = (testCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start; testCase != pTVar2;
        testCase = testCase + 1) {
      bVar3 = isThrowSafe(testCase,config);
      filter = extraout_RDX_00;
      if (bVar3) {
        bVar3 = Filter::matches((Filter *)this_00,testCase->m_info);
        filter = extraout_RDX_01;
        if (bVar3) {
          local_68.name._M_dataplus._M_p = (pointer)testCase;
          std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>::
          emplace_back<Catch::TestCaseHandle_const*>
                    ((vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>
                      *)&currentMatches,(TestCaseHandle **)&local_68);
          filter = extraout_RDX_02;
        }
      }
    }
    extractFilterName_abi_cxx11_(&local_68.name,this_00,filter);
    std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
    vector(&local_68.tests,&currentMatches);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    emplace_back<Catch::TestSpec::FilterMatch>(__return_storage_ptr__,&local_68);
    FilterMatch::~FilterMatch(&local_68);
    std::_Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ::~_Vector_base((_Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                     *)&currentMatches);
    filter = extraout_RDX_03;
  }
  return __return_storage_ptr__;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCaseHandle> const& testCases, IConfig const& config ) const {
        Matches matches;
        matches.reserve( m_filters.size() );
        for ( auto const& filter : m_filters ) {
            std::vector<TestCaseHandle const*> currentMatches;
            for ( auto const& test : testCases )
                if ( isThrowSafe( test, config ) &&
                     filter.matches( test.getTestCaseInfo() ) )
                    currentMatches.emplace_back( &test );
            matches.push_back(
                FilterMatch{ extractFilterName( filter ), currentMatches } );
        }
        return matches;
    }